

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u8 minMaxQuery(AggInfo *pAggInfo,ExprList **ppMinMax)

{
  Expr *pEVar1;
  ExprList *pEVar2;
  char *zLeft;
  u8 uVar3;
  int iVar4;
  char *zFunc;
  ExprList *pEList;
  Expr *pExpr;
  int eRet;
  ExprList **ppMinMax_local;
  AggInfo *pAggInfo_local;
  
  uVar3 = '\0';
  pExpr._4_1_ = '\0';
  *ppMinMax = (ExprList *)0x0;
  if (pAggInfo->nFunc == 1) {
    pEVar1 = pAggInfo->aFunc->pExpr;
    pEVar2 = (pEVar1->x).pList;
    pExpr._4_1_ = uVar3;
    if (((pEVar2 != (ExprList *)0x0) && (pEVar2->nExpr == 1)) && (pEVar2->a->pExpr->op == 0x9a)) {
      zLeft = (pEVar1->u).zToken;
      iVar4 = sqlite3_stricmp(zLeft,"min");
      if (iVar4 == 0) {
        *ppMinMax = pEVar2;
        pExpr._4_1_ = '\x01';
      }
      else {
        iVar4 = sqlite3_stricmp(zLeft,"max");
        if (iVar4 == 0) {
          pExpr._4_1_ = '\x02';
          *ppMinMax = pEVar2;
        }
      }
    }
  }
  return pExpr._4_1_;
}

Assistant:

static u8 minMaxQuery(AggInfo *pAggInfo, ExprList **ppMinMax){
  int eRet = WHERE_ORDERBY_NORMAL;          /* Return value */

  *ppMinMax = 0;
  if( pAggInfo->nFunc==1 ){
    Expr *pExpr = pAggInfo->aFunc[0].pExpr; /* Aggregate function */
    ExprList *pEList = pExpr->x.pList;      /* Arguments to agg function */

    assert( pExpr->op==TK_AGG_FUNCTION );
    if( pEList && pEList->nExpr==1 && pEList->a[0].pExpr->op==TK_AGG_COLUMN ){
      const char *zFunc = pExpr->u.zToken;
      if( sqlite3StrICmp(zFunc, "min")==0 ){
        eRet = WHERE_ORDERBY_MIN;
        *ppMinMax = pEList;
      }else if( sqlite3StrICmp(zFunc, "max")==0 ){
        eRet = WHERE_ORDERBY_MAX;
        *ppMinMax = pEList;
      }
    }
  }

  assert( *ppMinMax==0 || (*ppMinMax)->nExpr==1 );
  return eRet;
}